

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall
wasm::TranslateToFuzzReader::addHangLimitChecks(TranslateToFuzzReader *this,Function *func)

{
  Expression *pEVar1;
  ArrayNew *pAVar2;
  bool bVar3;
  reference ppLVar4;
  Expression *pEVar5;
  Block *pBVar6;
  reference ppAVar7;
  Const *right;
  Binary *pBVar8;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  ArrayNew *arrayNew;
  iterator __end1_1;
  iterator __begin1_1;
  vector<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_> *__range1_1;
  optional<wasm::Type> local_80;
  undefined1 local_70 [2] [12];
  Loop *local_50;
  Loop *loop;
  iterator __end1;
  iterator __begin1;
  vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_> *__range1;
  Function *func_local;
  TranslateToFuzzReader *this_local;
  
  FindAll<wasm::Loop>::FindAll((FindAll<wasm::Loop> *)&__begin1,func->body);
  __end1 = std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>::begin
                     ((vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_> *)&__begin1);
  loop = (Loop *)std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>::end
                           ((vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_> *)&__begin1);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<wasm::Loop_**,_std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>_>
                                *)&loop);
    if (!bVar3) break;
    ppLVar4 = __gnu_cxx::
              __normal_iterator<wasm::Loop_**,_std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>_>
              ::operator*(&__end1);
    local_50 = *ppLVar4;
    pEVar5 = makeHangLimitCheck(this);
    pEVar1 = local_50->body;
    std::optional<wasm::Type>::optional<wasm::Type_&,_true>
              ((optional<wasm::Type> *)local_70,
               &(local_50->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type)
    ;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._12_4_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)local_70[0]._0_8_;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_70[0][8];
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_3_ = local_70[0]._9_3_;
    pBVar6 = Builder::makeSequence(&this->builder,pEVar5,pEVar1,type);
    local_50->body = (Expression *)pBVar6;
    __gnu_cxx::
    __normal_iterator<wasm::Loop_**,_std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>_>::
    operator++(&__end1);
  }
  FindAll<wasm::Loop>::~FindAll((FindAll<wasm::Loop> *)&__begin1);
  pEVar5 = makeHangLimitCheck(this);
  pEVar1 = func->body;
  __range1_1 = (vector<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_> *)
               Function::getResults(func);
  std::optional<wasm::Type>::optional<wasm::Type,_true>(&local_80,(Type *)&__range1_1);
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_7_ = 0;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload =
       local_80.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged =
       local_80.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_engaged;
  pBVar6 = Builder::makeSequence(&this->builder,pEVar5,pEVar1,type_00);
  func->body = (Expression *)pBVar6;
  FindAll<wasm::ArrayNew>::FindAll((FindAll<wasm::ArrayNew> *)&__begin1_1,func->body);
  __end1_1 = std::vector<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>::begin
                       ((vector<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_> *)&__begin1_1);
  arrayNew = (ArrayNew *)
             std::vector<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>::end
                       ((vector<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_> *)&__begin1_1);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<wasm::ArrayNew_**,_std::vector<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>_>
                        *)&arrayNew);
    if (!bVar3) break;
    ppAVar7 = __gnu_cxx::
              __normal_iterator<wasm::ArrayNew_**,_std::vector<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>_>
              ::operator*(&__end1_1);
    pAVar2 = *ppAVar7;
    bVar3 = oneIn(this,100);
    if (!bVar3) {
      pEVar1 = pAVar2->size;
      right = Builder::makeConst<int>(&this->builder,0x3ff);
      pBVar8 = Builder::makeBinary(&this->builder,AndInt32,pEVar1,(Expression *)right);
      pAVar2->size = (Expression *)pBVar8;
    }
    __gnu_cxx::
    __normal_iterator<wasm::ArrayNew_**,_std::vector<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>_>
    ::operator++(&__end1_1);
  }
  FindAll<wasm::ArrayNew>::~FindAll((FindAll<wasm::ArrayNew> *)&__begin1_1);
  return;
}

Assistant:

void TranslateToFuzzReader::addHangLimitChecks(Function* func) {
  // loop limit
  for (auto* loop : FindAll<Loop>(func->body).list) {
    loop->body =
      builder.makeSequence(makeHangLimitCheck(), loop->body, loop->type);
  }
  // recursion limit
  func->body =
    builder.makeSequence(makeHangLimitCheck(), func->body, func->getResults());
  // ArrayNew can hang the fuzzer if the array size is massive. This doesn't
  // cause an OOM (which the fuzzer knows how to ignore) but it just works for
  // many seconds on building the array. To avoid that, limit the size with high
  // probability.
  for (auto* arrayNew : FindAll<ArrayNew>(func->body).list) {
    if (!oneIn(100)) {
      arrayNew->size = builder.makeBinary(
        AndInt32, arrayNew->size, builder.makeConst(int32_t(1024 - 1)));
    }
  }
}